

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O2

bool __thiscall cmBinUtilsMacOSMachOLinker::Prepare(cmBinUtilsMacOSMachOLinker *this)

{
  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool *pcVar1;
  _func_int **pp_Var2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  string tool;
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1c8;
  string local_1a8;
  ostream local_188;
  
  psVar4 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
                     ((this->super_cmBinUtilsLinker).Archive);
  std::__cxx11::string::string((string *)&bStack_1c8,(string *)psVar4);
  if (bStack_1c8._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&bStack_1c8);
  }
  bVar3 = std::operator==(&bStack_1c8,"otool");
  if (bVar3) {
    std::
    make_unique<cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool,cmRuntimeDependencyArchive*&>
              ((cmRuntimeDependencyArchive **)&local_188);
    pp_Var2 = local_188._vptr_basic_ostream;
    local_188._vptr_basic_ostream = (_func_int **)0x0;
    pcVar1 = (this->Tool)._M_t.
             super___uniq_ptr_impl<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>_>
             .super__Head_base<0UL,_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool_*,_false>.
             _M_head_impl;
    (this->Tool)._M_t.
    super___uniq_ptr_impl<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsMacOSMachOGetRuntimeDependenciesTool>_>
    .super__Head_base<0UL,_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool_*,_false>._M_head_impl =
         (cmBinUtilsMacOSMachOGetRuntimeDependenciesTool *)pp_Var2;
    if (pcVar1 != (cmBinUtilsMacOSMachOGetRuntimeDependenciesTool *)0x0) {
      (*pcVar1->_vptr_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool[1])();
      if ((cmBinUtilsMacOSMachOGetRuntimeDependenciesTool *)local_188._vptr_basic_ostream !=
          (cmBinUtilsMacOSMachOGetRuntimeDependenciesTool *)0x0) {
        (*(*(_func_int ***)local_188._vptr_basic_ostream)[1])();
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
    poVar5 = std::operator<<(&local_188,"Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: ");
    std::operator<<(poVar5,(string *)&bStack_1c8);
    std::__cxx11::stringbuf::str();
    cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  }
  std::__cxx11::string::~string((string *)&bStack_1c8);
  return bVar3;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::Prepare()
{
  std::string tool = this->Archive->GetGetRuntimeDependenciesTool();
  if (tool.empty()) {
    tool = "otool";
  }
  if (tool == "otool") {
    this->Tool =
      cm::make_unique<cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool>(
        this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: " << tool;
    this->SetError(e.str());
    return false;
  }

  return true;
}